

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# schema-loader.c++
# Opt level: O1

RawSchema * __thiscall capnp::SchemaLoader::Impl::loadNative(Impl *this,RawSchema *nativeSchema)

{
  uint64_t uVar1;
  word *pwVar2;
  uint16_t *puVar3;
  uint32_t uVar4;
  uint32_t uVar5;
  uint32_t uVar6;
  undefined4 uVar7;
  bool bVar8;
  Maybe<capnp::_::RawSchema_*&> MVar9;
  RawSchema *schema;
  RawSchema **ppRVar10;
  RawSchema *pRVar11;
  Maybe<capnp::SchemaLoader::Impl::RequiredSize_&> MVar12;
  ulong uVar13;
  byte unaff_R13B;
  ArrayPtr<const_capnp::_::RawBrandedSchema::Dependency> AVar14;
  Fault f;
  CompatibilityChecker checker;
  Reader existing;
  ArrayPtr<const_char> local_88;
  Reader native;
  Maybe<kj::ArrayPtr<const_capnp::_::RawBrandedSchema::Scope>_> local_48;
  
  MVar9 = kj::HashMap<unsigned_long,capnp::_::RawSchema*>::find<unsigned_long_const&>
                    ((HashMap<unsigned_long,capnp::_::RawSchema*> *)&this->schemas,&nativeSchema->id
                    );
  if (MVar9.ptr == (RawSchema **)0x0) {
    unaff_R13B = 0;
    schema = (RawSchema *)kj::Arena::allocateBytes(&this->arena,0x70,8,false);
    (schema->defaultBrand).generic = (RawSchema *)0x0;
    (schema->defaultBrand).scopes = (Scope *)0x0;
    (schema->defaultBrand).dependencies = (Dependency *)0x0;
    (schema->defaultBrand).scopeCount = 0;
    (schema->defaultBrand).dependencyCount = 0;
    (schema->defaultBrand).generic = schema;
    schema->lazyInitializer = (Initializer *)0x0;
    (schema->defaultBrand).lazyInitializer = (Initializer *)0x0;
    checker.loader = (Impl *)nativeSchema->id;
    checker.nodeName.super_StringPtr.content.ptr = (char *)schema;
    kj::
    Table<kj::HashMap<unsigned_long,_capnp::_::RawSchema_*>::Entry,_kj::HashIndex<kj::HashMap<unsigned_long,_capnp::_::RawSchema_*>::Callbacks>_>
    ::insert(&(this->schemas).table,(Entry *)&checker);
    bVar8 = true;
    pRVar11 = (RawSchema *)0x1;
  }
  else {
    schema = *MVar9.ptr;
    pRVar11 = schema->canCastTo;
    if (pRVar11 == (RawSchema *)0x0) {
      checker.nodeName.super_StringPtr.content.size_ = (size_t)schema->encodedNode;
      checker.loader = (Impl *)0x0;
      checker.nodeName.super_StringPtr.content.ptr = (char *)0x0;
      checker.existingNode._reader.segment =
           (SegmentReader *)CONCAT44(checker.existingNode._reader.segment._4_4_,0x7fffffff);
      _::PointerReader::getStruct(&existing._reader,(PointerReader *)&checker,(word *)0x0);
      checker.nodeName.super_StringPtr.content.size_ = (size_t)nativeSchema->encodedNode;
      checker.loader = (Impl *)0x0;
      checker.nodeName.super_StringPtr.content.ptr = (char *)0x0;
      checker.existingNode._reader.segment =
           (SegmentReader *)CONCAT44(checker.existingNode._reader.segment._4_4_,0x7fffffff);
      _::PointerReader::getStruct(&native._reader,(PointerReader *)&checker,(word *)0x0);
      checker.nodeName.super_StringPtr.content.ptr = "";
      checker.nodeName.super_StringPtr.content.size_ = 1;
      checker.existingNode._reader.segment = (SegmentReader *)0x0;
      checker.existingNode._reader.capTable = (CapTableReader *)0x0;
      checker.existingNode._reader.data = (void *)0x0;
      checker.existingNode._reader.pointers._0_6_ = 0;
      checker.existingNode._reader.pointers._6_2_ = 0;
      checker.existingNode._reader.dataSize = 0;
      checker.existingNode._reader.pointerCount = 0;
      checker.existingNode._reader.nestingLimit = 0x7fffffff;
      checker.replacementNode._reader.segment = (SegmentReader *)0x0;
      checker.replacementNode._reader.capTable = (CapTableReader *)0x0;
      checker.replacementNode._reader.data = (void *)0x0;
      checker.replacementNode._reader.pointers._0_6_ = 0;
      checker.replacementNode._reader.pointers._6_2_ = 0;
      checker.replacementNode._reader.dataSize = 0;
      checker.replacementNode._reader.pointerCount = 0;
      checker.replacementNode._reader.nestingLimit = 0x7fffffff;
      checker.loader = this;
      bVar8 = CompatibilityChecker::shouldReplace(&checker,&existing,(Reader *)&native._reader,true)
      ;
      pRVar11 = (RawSchema *)(ulong)bVar8;
      unaff_R13B = schema->lazyInitializer != (Initializer *)0x0;
      bVar8 = true;
    }
    else {
      if (pRVar11 != nativeSchema) {
        existing._reader.data = nativeSchema->encodedNode;
        existing._reader.segment = (SegmentReader *)0x0;
        existing._reader.capTable = (CapTableReader *)0x0;
        existing._reader.pointers._0_4_ = 0x7fffffff;
        _::PointerReader::getStruct((StructReader *)&checker,(PointerReader *)&existing,(word *)0x0)
        ;
        local_88 = (ArrayPtr<const_char>)
                   capnp::schema::Node::Reader::getDisplayName((Reader *)&checker);
        native._reader.data = schema->canCastTo->encodedNode;
        native._reader._0_16_ = ZEXT816(0);
        native._reader.pointers._0_4_ = 0x7fffffff;
        _::PointerReader::getStruct(&existing._reader,(PointerReader *)&native,(word *)0x0);
        native._reader._0_16_ =
             capnp::schema::Node::Reader::getDisplayName((Reader *)&existing._reader);
        kj::_::Debug::Fault::
        Fault<kj::Exception::Type,char_const(&)[53],unsigned_long_const&,capnp::Text::Reader,capnp::Text::Reader>
                  (&f,
                   "/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/capnp/schema-loader.c++"
                   ,0x52e,FAILED,"schema->canCastTo == nativeSchema",
                   "\"two different compiled-in type have the same type ID\", nativeSchema->id, readMessageUnchecked<schema::Node>(nativeSchema->encodedNode).getDisplayName(), readMessageUnchecked<schema::Node>(schema->canCastTo->encodedNode).getDisplayName()"
                   ,(char (*) [53])"two different compiled-in type have the same type ID",
                   &nativeSchema->id,(Reader *)&local_88,(Reader *)&native);
        kj::_::Debug::Fault::fatal(&f);
      }
      bVar8 = false;
    }
  }
  if (bVar8) {
    if (((ulong)pRVar11 & 1) == 0) {
      schema->canCastTo = nativeSchema;
      if (nativeSchema->dependencyCount != 0) {
        uVar13 = 0;
        do {
          loadNative(this,nativeSchema->dependencies[uVar13]);
          uVar13 = uVar13 + 1;
        } while (uVar13 < nativeSchema->dependencyCount);
      }
    }
    else {
      checker.existingNode._reader.capTable =
           (CapTableReader *)(nativeSchema->defaultBrand).lazyInitializer;
      checker.loader = (Impl *)(nativeSchema->defaultBrand).generic;
      checker.nodeName.super_StringPtr.content.ptr = (char *)(nativeSchema->defaultBrand).scopes;
      checker.nodeName.super_StringPtr.content.size_ =
           (size_t)(nativeSchema->defaultBrand).dependencies;
      checker.existingNode._reader.segment =
           *(SegmentReader **)&(nativeSchema->defaultBrand).scopeCount;
      uVar1 = nativeSchema->id;
      pwVar2 = nativeSchema->encodedNode;
      uVar6 = nativeSchema->encodedSize;
      uVar7 = *(undefined4 *)&nativeSchema->field_0x14;
      ppRVar10 = nativeSchema->dependencies;
      puVar3 = nativeSchema->membersByName;
      uVar4 = nativeSchema->dependencyCount;
      uVar5 = nativeSchema->memberCount;
      pRVar11 = nativeSchema->canCastTo;
      schema->membersByDiscriminant = nativeSchema->membersByDiscriminant;
      schema->canCastTo = pRVar11;
      schema->membersByName = puVar3;
      schema->dependencyCount = uVar4;
      schema->memberCount = uVar5;
      schema->encodedSize = uVar6;
      *(undefined4 *)&schema->field_0x14 = uVar7;
      schema->dependencies = ppRVar10;
      schema->id = uVar1;
      schema->encodedNode = pwVar2;
      (schema->defaultBrand).generic = (RawSchema *)checker.loader;
      (schema->defaultBrand).scopes = (Scope *)checker.nodeName.super_StringPtr.content.ptr;
      (schema->defaultBrand).dependencies =
           (Dependency *)checker.nodeName.super_StringPtr.content.size_;
      *(SegmentReader **)&(schema->defaultBrand).scopeCount = checker.existingNode._reader.segment;
      (schema->defaultBrand).lazyInitializer = (Initializer *)checker.existingNode._reader.capTable;
      (schema->defaultBrand).generic = schema;
      schema->canCastTo = nativeSchema;
      ppRVar10 = (RawSchema **)
                 kj::Arena::allocateBytes(&this->arena,(ulong)schema->dependencyCount << 3,8,false);
      if (nativeSchema->dependencyCount != 0) {
        uVar13 = 0;
        do {
          pRVar11 = loadNative(this,nativeSchema->dependencies[uVar13]);
          ppRVar10[uVar13] = pRVar11;
          uVar13 = uVar13 + 1;
        } while (uVar13 < nativeSchema->dependencyCount);
      }
      schema->dependencies = ppRVar10;
      local_48.ptr.field_1.value.ptr = (Scope *)0x0;
      local_48.ptr.field_1.value.size_ = 0;
      local_48.ptr.isSet = true;
      AVar14 = makeBrandedDependencies(this,schema,&local_48);
      (schema->defaultBrand).dependencies = AVar14.ptr;
      (schema->defaultBrand).dependencyCount = (uint32_t)AVar14.size_;
      MVar12 = kj::HashMap<unsigned_long,capnp::SchemaLoader::Impl::RequiredSize>::
               find<unsigned_long_const&>
                         ((HashMap<unsigned_long,capnp::SchemaLoader::Impl::RequiredSize> *)
                          &this->structSizeRequirements,&nativeSchema->id);
      if (MVar12.ptr != (RequiredSize *)0x0) {
        applyStructSizeRequirement
                  (this,schema,(uint)(MVar12.ptr)->dataWordCount,(uint)(MVar12.ptr)->pointerCount);
      }
    }
    if ((unaff_R13B & 1) != 0) {
      schema->lazyInitializer = (Initializer *)0x0;
      (schema->defaultBrand).lazyInitializer = (Initializer *)0x0;
    }
  }
  return schema;
}

Assistant:

_::RawSchema* SchemaLoader::Impl::loadNative(const _::RawSchema* nativeSchema) {
  _::RawSchema* schema;
  bool shouldReplace;
  bool shouldClearInitializer;
  KJ_IF_MAYBE(match, schemas.find(nativeSchema->id)) {
    schema = *match;
    if (schema->canCastTo != nullptr) {
      // Already loaded natively, or we're currently in the process of loading natively and there
      // was a dependency cycle.
      KJ_REQUIRE(schema->canCastTo == nativeSchema,
          "two different compiled-in type have the same type ID",
          nativeSchema->id,
          readMessageUnchecked<schema::Node>(nativeSchema->encodedNode).getDisplayName(),
          readMessageUnchecked<schema::Node>(schema->canCastTo->encodedNode).getDisplayName());
      return schema;
    } else {
      auto existing = readMessageUnchecked<schema::Node>(schema->encodedNode);
      auto native = readMessageUnchecked<schema::Node>(nativeSchema->encodedNode);
      CompatibilityChecker checker(*this);
      shouldReplace = checker.shouldReplace(existing, native, true);
      shouldClearInitializer = schema->lazyInitializer != nullptr;
    }
  } else {
    schema = &arena.allocate<_::RawSchema>();
    memset(&schema->defaultBrand, 0, sizeof(schema->defaultBrand));
    schema->defaultBrand.generic = schema;
    schema->lazyInitializer = nullptr;
    schema->defaultBrand.lazyInitializer = nullptr;
    shouldReplace = true;
    shouldClearInitializer = false;  // already cleared above
    schemas.insert(nativeSchema->id, schema);
  }